

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scrypt.cc
# Opt level: O2

void scryptBlockMix(block_t *out,block_t *B,uint64_t r)

{
  ulong uVar1;
  int i;
  long lVar2;
  uint64_t uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint local_128 [16];
  ulong local_e8;
  ulong local_e0;
  ulong local_d8;
  ulong local_d0;
  ulong local_c8;
  int local_bc;
  block_t *local_b8;
  uint64_t local_b0;
  block_t *local_a8;
  ulong local_a0;
  ulong local_98;
  ulong local_90;
  ulong local_88;
  ulong local_80;
  block_t X;
  
  local_a8 = out;
  if (out != B) {
    local_a0 = r * 2;
    X.words._0_8_ = *(undefined8 *)B[r * 2 + -1].words;
    X.words._8_8_ = *(undefined8 *)(B[r * 2 + -1].words + 2);
    X.words._16_8_ = *(undefined8 *)(B[r * 2 + -1].words + 4);
    X.words._24_8_ = *(undefined8 *)(B[r * 2 + -1].words + 4 + 2);
    X.words._32_8_ = *(undefined8 *)(B[r * 2 + -1].words + 8);
    X.words._40_8_ = *(undefined8 *)(B[r * 2 + -1].words + 8 + 2);
    X.words._48_8_ = *(undefined8 *)(B[r * 2 + -1].words + 0xc);
    X.words._56_8_ = *(undefined8 *)(B[r * 2 + -1].words + 0xc + 2);
    local_b8 = B;
    local_b0 = r;
    for (local_98 = 0; local_98 != local_a0; local_98 = local_98 + 1) {
      xor_block(&X,&X,local_b8 + local_98);
      local_128[0] = X.words[0];
      local_d8 = (ulong)X.words._0_8_ >> 0x20;
      local_128[0xc] = X.words[0xc];
      local_128[0xd] = X.words[0xd];
      local_128[4] = X.words[4];
      local_128[5] = X.words[5];
      local_128[8] = X.words[8];
      local_128[9] = X.words[9];
      local_128[10] = X.words[10];
      local_e0 = X.words._24_8_ & 0xffffffff;
      local_128[0xe] = X.words[0xe];
      local_e8 = X.words._8_8_ & 0xffffffff;
      local_128[0xf] = X.words[0xf];
      local_128[0xb] = X.words[0xb];
      local_c8 = (ulong)X.words._8_8_ >> 0x20;
      local_d0 = (ulong)X.words._24_8_ >> 0x20;
      for (iVar4 = -8; local_128[1] = (uint)local_d8, local_128[6] = (uint)local_e0, iVar4 != 0;
          iVar4 = iVar4 + 2) {
        local_128[4] = ((local_128[0] + local_128[0xc]) * 0x80 |
                       local_128[0] + local_128[0xc] >> 0x19) ^ local_128[4];
        local_128[8] = ((local_128[0] + local_128[4]) * 0x200 | local_128[0] + local_128[4] >> 0x17)
                       ^ local_128[8];
        local_88 = (ulong)local_128[8];
        local_128[0xc] =
             ((local_128[8] + local_128[4]) * 0x2000 | local_128[8] + local_128[4] >> 0x13) ^
             local_128[0xc];
        local_80 = (ulong)local_128[0xc];
        local_128[0] = ((local_128[0xc] + local_128[8]) * 0x40000 |
                       local_128[0xc] + local_128[8] >> 0xe) ^ local_128[0];
        local_128[9] = ((local_128[1] + local_128[5]) * 0x80 | local_128[1] + local_128[5] >> 0x19)
                       ^ local_128[9];
        local_128[0xd] =
             ((local_128[9] + local_128[5]) * 0x200 | local_128[9] + local_128[5] >> 0x17) ^
             local_128[0xd];
        local_90 = (ulong)local_128[0xd];
        local_128[1] = ((local_128[0xd] + local_128[9]) * 0x2000 |
                       local_128[0xd] + local_128[9] >> 0x13) ^ local_128[1];
        uVar5 = local_128[0xd] + local_128[1];
        local_128[5] = (uVar5 * 0x40000 | uVar5 >> 0xe) ^ local_128[5];
        local_128[0xe] =
             ((local_128[10] + local_128[6]) * 0x80 | local_128[10] + local_128[6] >> 0x19) ^
             local_128[0xe];
        local_e8._0_4_ =
             ((local_128[0xe] + local_128[10]) * 0x200 | local_128[0xe] + local_128[10] >> 0x17) ^
             (uint)local_e8;
        local_128[6] = (((uint)local_e8 + local_128[0xe]) * 0x2000 |
                       (uint)local_e8 + local_128[0xe] >> 0x13) ^ local_128[6];
        uVar5 = local_128[6] + (uint)local_e8;
        local_128[10] = (uVar5 * 0x40000 | uVar5 >> 0xe) ^ local_128[10];
        local_c8._0_4_ =
             ((local_128[0xf] + local_128[0xb]) * 0x80 | local_128[0xf] + local_128[0xb] >> 0x19) ^
             (uint)local_c8;
        local_d0._0_4_ =
             (((uint)local_c8 + local_128[0xf]) * 0x200 | (uint)local_c8 + local_128[0xf] >> 0x17) ^
             (uint)local_d0;
        local_128[0xb] =
             (((uint)local_c8 + (uint)local_d0) * 0x2000 | (uint)local_c8 + (uint)local_d0 >> 0x13)
             ^ local_128[0xb];
        uVar5 = local_128[0xb] + (uint)local_d0;
        local_128[0xf] = (uVar5 * 0x40000 | uVar5 >> 0xe) ^ local_128[0xf];
        local_128[1] = ((local_128[0] + (uint)local_c8) * 0x80 |
                       local_128[0] + (uint)local_c8 >> 0x19) ^ local_128[1];
        local_d8 = (ulong)local_128[1];
        uVar6 = ((local_128[1] + local_128[0]) * 0x200 | local_128[1] + local_128[0] >> 0x17) ^
                (uint)local_e8;
        local_e8 = (ulong)uVar6;
        uVar5 = ((uVar6 + local_128[1]) * 0x2000 | uVar6 + local_128[1] >> 0x13) ^ (uint)local_c8;
        local_c8 = (ulong)uVar5;
        uVar5 = uVar5 + uVar6;
        local_128[0] = (uVar5 * 0x40000 | uVar5 >> 0xe) ^ local_128[0];
        local_128[6] = ((local_128[5] + local_128[4]) * 0x80 | local_128[5] + local_128[4] >> 0x19)
                       ^ local_128[6];
        local_e0 = (ulong)local_128[6];
        uVar5 = ((local_128[6] + local_128[5]) * 0x200 | local_128[6] + local_128[5] >> 0x17) ^
                (uint)local_d0;
        local_d0 = (ulong)uVar5;
        local_128[4] = ((uVar5 + local_128[6]) * 0x2000 | uVar5 + local_128[6] >> 0x13) ^
                       local_128[4];
        local_128[5] = ((local_128[4] + uVar5) * 0x40000 | local_128[4] + uVar5 >> 0xe) ^
                       local_128[5];
        local_128[0xb] =
             ((local_128[10] + local_128[9]) * 0x80 | local_128[10] + local_128[9] >> 0x19) ^
             local_128[0xb];
        local_128[8] = ((local_128[10] + local_128[0xb]) * 0x200 |
                       local_128[10] + local_128[0xb] >> 0x17) ^ local_128[8];
        local_128[9] = ((local_128[8] + local_128[0xb]) * 0x2000 |
                       local_128[8] + local_128[0xb] >> 0x13) ^ local_128[9];
        local_128[10] =
             ((local_128[9] + local_128[8]) * 0x40000 | local_128[9] + local_128[8] >> 0xe) ^
             local_128[10];
        local_128[0xc] =
             ((local_128[0xf] + local_128[0xe]) * 0x80 | local_128[0xf] + local_128[0xe] >> 0x19) ^
             local_128[0xc];
        local_128[0xd] =
             ((local_128[0xc] + local_128[0xf]) * 0x200 | local_128[0xc] + local_128[0xf] >> 0x17) ^
             local_128[0xd];
        local_128[0xe] =
             ((local_128[0xd] + local_128[0xc]) * 0x2000 | local_128[0xd] + local_128[0xc] >> 0x13)
             ^ local_128[0xe];
        local_128[0xf] =
             ((local_128[0xe] + local_128[0xd]) * 0x40000 | local_128[0xe] + local_128[0xd] >> 0xe)
             ^ local_128[0xf];
        local_bc = iVar4;
      }
      local_128[3] = (uint)local_c8;
      local_128[2] = (uint)local_e8;
      local_128[7] = (uint)local_d0;
      for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
        X.words[lVar2] = X.words[lVar2] + local_128[lVar2];
      }
      uVar3 = 0;
      if ((local_98 & 1) != 0) {
        uVar3 = local_b0;
      }
      uVar1 = local_98 & 0x7fffffffffffffe;
      *(undefined8 *)(local_a8[uVar3].words + uVar1 * 8 + 0xc) = X.words._48_8_;
      *(undefined8 *)(local_a8[uVar3].words + uVar1 * 8 + 0xc + 2) = X.words._56_8_;
      *(undefined8 *)(local_a8[uVar3].words + uVar1 * 8 + 8) = X.words._32_8_;
      *(undefined8 *)(local_a8[uVar3].words + uVar1 * 8 + 8 + 2) = X.words._40_8_;
      *(undefined8 *)(local_a8[uVar3].words + uVar1 * 8 + 4) = X.words._16_8_;
      *(undefined8 *)(local_a8[uVar3].words + uVar1 * 8 + 4 + 2) = X.words._24_8_;
      *(undefined8 *)(local_a8[uVar3].words + uVar1 * 8) = X.words._0_8_;
      *(undefined8 *)(local_a8[uVar3].words + uVar1 * 8 + 2) = X.words._8_8_;
    }
    return;
  }
  __assert_fail("out != B",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/scrypt.cc"
                ,99,"void scryptBlockMix(block_t *, const block_t *, uint64_t)");
}

Assistant:

static void scryptBlockMix(block_t *out, const block_t *B, uint64_t r) {
  assert(out != B);

  block_t X;
  OPENSSL_memcpy(&X, &B[r * 2 - 1], sizeof(X));
  for (uint64_t i = 0; i < r * 2; i++) {
    xor_block(&X, &X, &B[i]);
    salsa208_word_specification(&X);

    // This implements the permutation in step 3.
    OPENSSL_memcpy(&out[i / 2 + (i & 1) * r], &X, sizeof(X));
  }
}